

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_GetParameterTolerance(double t0,double t1,double t,double *tminus,double *tplus)

{
  double tmax;
  double tmin;
  double dt;
  bool rc;
  double *tplus_local;
  double *tminus_local;
  double t_local;
  double t1_local;
  double t0_local;
  
  if (t0 < t1) {
    tminus_local = (double *)t0;
    if ((t0 <= t) && (tminus_local = (double *)t, t1 < t)) {
      tminus_local = (double *)t1;
    }
    tmin = (t1 - t0) * 8.0 * 1.490116119385e-08 + (ABS(t0) + ABS(t1)) * 2.220446049250313e-16;
    if (t1 - t0 <= tmin) {
      tmin = (t1 - t0) * 0.5;
    }
    if (tminus != (double *)0x0) {
      *tminus = (double)tminus_local - tmin;
    }
    if (tplus != (double *)0x0) {
      *tplus = (double)tminus_local + tmin;
    }
  }
  return t0 < t1;
}

Assistant:

bool 
ON_GetParameterTolerance(
        double t0, double t1, // domain
        double t,          // parameter in domain
        double* tminus, double* tplus// parameter tolerance (tminus, tplus) returned here
        )
{
  const bool rc = (t0 < t1) ? true : false;
  if ( rc ) {
    if ( t < t0 )
      t = t0;
    else if (t > t1 )
      t = t1;
    double dt = (t1-t0)*8.0* ON_SQRT_EPSILON + (fabs(t0) + fabs(t1))* ON_EPSILON;
    if ( dt >= t1-t0 )
      dt = 0.5*(t1-t0);
    const double tmin = t-dt;
    const double tmax = t+dt;
    if ( tminus )
      *tminus = tmin;
    if ( tplus )
      *tplus = tmax;
  }

  return rc;
}